

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O0

bool __thiscall slang::ast::Type::isNumeric(Type *this)

{
  bool bVar1;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  bVar1 = isIntegral((Type *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar2 = true;
  if (!bVar1) {
    bVar2 = isFloating((Type *)0x648e0d);
  }
  return bVar2;
}

Assistant:

bool isNumeric() const { return isIntegral() || isFloating(); }